

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_LChar * coda_XML_ErrorString(XML_Error code)

{
  char *pcStack_10;
  XML_Error code_local;
  
  switch(code) {
  case XML_ERROR_NONE:
    pcStack_10 = (XML_LChar *)0x0;
    break;
  case XML_ERROR_NO_MEMORY:
    pcStack_10 = "out of memory";
    break;
  case XML_ERROR_SYNTAX:
    pcStack_10 = "syntax error";
    break;
  case XML_ERROR_NO_ELEMENTS:
    pcStack_10 = "no element found";
    break;
  case XML_ERROR_INVALID_TOKEN:
    pcStack_10 = "not well-formed (invalid token)";
    break;
  case XML_ERROR_UNCLOSED_TOKEN:
    pcStack_10 = "unclosed token";
    break;
  case XML_ERROR_PARTIAL_CHAR:
    pcStack_10 = "partial character";
    break;
  case XML_ERROR_TAG_MISMATCH:
    pcStack_10 = "mismatched tag";
    break;
  case XML_ERROR_DUPLICATE_ATTRIBUTE:
    pcStack_10 = "duplicate attribute";
    break;
  case XML_ERROR_JUNK_AFTER_DOC_ELEMENT:
    pcStack_10 = "junk after document element";
    break;
  case XML_ERROR_PARAM_ENTITY_REF:
    pcStack_10 = "illegal parameter entity reference";
    break;
  case XML_ERROR_UNDEFINED_ENTITY:
    pcStack_10 = "undefined entity";
    break;
  case XML_ERROR_RECURSIVE_ENTITY_REF:
    pcStack_10 = "recursive entity reference";
    break;
  case XML_ERROR_ASYNC_ENTITY:
    pcStack_10 = "asynchronous entity";
    break;
  case XML_ERROR_BAD_CHAR_REF:
    pcStack_10 = "reference to invalid character number";
    break;
  case XML_ERROR_BINARY_ENTITY_REF:
    pcStack_10 = "reference to binary entity";
    break;
  case XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF:
    pcStack_10 = "reference to external entity in attribute";
    break;
  case XML_ERROR_MISPLACED_XML_PI:
    pcStack_10 = "XML or text declaration not at start of entity";
    break;
  case XML_ERROR_UNKNOWN_ENCODING:
    pcStack_10 = "unknown encoding";
    break;
  case XML_ERROR_INCORRECT_ENCODING:
    pcStack_10 = "encoding specified in XML declaration is incorrect";
    break;
  case XML_ERROR_UNCLOSED_CDATA_SECTION:
    pcStack_10 = "unclosed CDATA section";
    break;
  case XML_ERROR_EXTERNAL_ENTITY_HANDLING:
    pcStack_10 = "error in processing external entity reference";
    break;
  case XML_ERROR_NOT_STANDALONE:
    pcStack_10 = "document is not standalone";
    break;
  case XML_ERROR_UNEXPECTED_STATE:
    pcStack_10 = "unexpected parser state - please send a bug report";
    break;
  case XML_ERROR_ENTITY_DECLARED_IN_PE:
    pcStack_10 = "entity declared in parameter entity";
    break;
  case XML_ERROR_FEATURE_REQUIRES_XML_DTD:
    pcStack_10 = "requested feature requires XML_DTD support in Expat";
    break;
  case XML_ERROR_CANT_CHANGE_FEATURE_ONCE_PARSING:
    pcStack_10 = "cannot change setting once parsing has begun";
    break;
  case XML_ERROR_UNBOUND_PREFIX:
    pcStack_10 = "unbound prefix";
    break;
  case XML_ERROR_UNDECLARING_PREFIX:
    pcStack_10 = "must not undeclare prefix";
    break;
  case XML_ERROR_INCOMPLETE_PE:
    pcStack_10 = "incomplete markup in parameter entity";
    break;
  case XML_ERROR_XML_DECL:
    pcStack_10 = "XML declaration not well-formed";
    break;
  case XML_ERROR_TEXT_DECL:
    pcStack_10 = "text declaration not well-formed";
    break;
  case XML_ERROR_PUBLICID:
    pcStack_10 = "illegal character(s) in public id";
    break;
  case XML_ERROR_SUSPENDED:
    pcStack_10 = "parser suspended";
    break;
  case XML_ERROR_NOT_SUSPENDED:
    pcStack_10 = "parser not suspended";
    break;
  case XML_ERROR_ABORTED:
    pcStack_10 = "parsing aborted";
    break;
  case XML_ERROR_FINISHED:
    pcStack_10 = "parsing finished";
    break;
  case XML_ERROR_SUSPEND_PE:
    pcStack_10 = "cannot suspend in external parameter entity";
    break;
  case XML_ERROR_RESERVED_PREFIX_XML:
    pcStack_10 = "reserved prefix (xml) must not be undeclared or bound to another namespace name";
    break;
  case XML_ERROR_RESERVED_PREFIX_XMLNS:
    pcStack_10 = "reserved prefix (xmlns) must not be declared or undeclared";
    break;
  case XML_ERROR_RESERVED_NAMESPACE_URI:
    pcStack_10 = "prefix must not be bound to one of the reserved namespace names";
    break;
  case XML_ERROR_INVALID_ARGUMENT:
    pcStack_10 = "invalid argument";
    break;
  case XML_ERROR_NO_BUFFER:
    pcStack_10 = "a successful prior call to function XML_GetBuffer is required";
    break;
  case XML_ERROR_AMPLIFICATION_LIMIT_BREACH:
    pcStack_10 = "limit on input amplification factor (from DTD and entities) breached";
    break;
  case XML_ERROR_NOT_STARTED:
    pcStack_10 = "parser not started";
    break;
  default:
    pcStack_10 = (XML_LChar *)0x0;
  }
  return pcStack_10;
}

Assistant:

const XML_LChar *XMLCALL
XML_ErrorString(enum XML_Error code) {
  switch (code) {
  case XML_ERROR_NONE:
    return NULL;
  case XML_ERROR_NO_MEMORY:
    return XML_L("out of memory");
  case XML_ERROR_SYNTAX:
    return XML_L("syntax error");
  case XML_ERROR_NO_ELEMENTS:
    return XML_L("no element found");
  case XML_ERROR_INVALID_TOKEN:
    return XML_L("not well-formed (invalid token)");
  case XML_ERROR_UNCLOSED_TOKEN:
    return XML_L("unclosed token");
  case XML_ERROR_PARTIAL_CHAR:
    return XML_L("partial character");
  case XML_ERROR_TAG_MISMATCH:
    return XML_L("mismatched tag");
  case XML_ERROR_DUPLICATE_ATTRIBUTE:
    return XML_L("duplicate attribute");
  case XML_ERROR_JUNK_AFTER_DOC_ELEMENT:
    return XML_L("junk after document element");
  case XML_ERROR_PARAM_ENTITY_REF:
    return XML_L("illegal parameter entity reference");
  case XML_ERROR_UNDEFINED_ENTITY:
    return XML_L("undefined entity");
  case XML_ERROR_RECURSIVE_ENTITY_REF:
    return XML_L("recursive entity reference");
  case XML_ERROR_ASYNC_ENTITY:
    return XML_L("asynchronous entity");
  case XML_ERROR_BAD_CHAR_REF:
    return XML_L("reference to invalid character number");
  case XML_ERROR_BINARY_ENTITY_REF:
    return XML_L("reference to binary entity");
  case XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF:
    return XML_L("reference to external entity in attribute");
  case XML_ERROR_MISPLACED_XML_PI:
    return XML_L("XML or text declaration not at start of entity");
  case XML_ERROR_UNKNOWN_ENCODING:
    return XML_L("unknown encoding");
  case XML_ERROR_INCORRECT_ENCODING:
    return XML_L("encoding specified in XML declaration is incorrect");
  case XML_ERROR_UNCLOSED_CDATA_SECTION:
    return XML_L("unclosed CDATA section");
  case XML_ERROR_EXTERNAL_ENTITY_HANDLING:
    return XML_L("error in processing external entity reference");
  case XML_ERROR_NOT_STANDALONE:
    return XML_L("document is not standalone");
  case XML_ERROR_UNEXPECTED_STATE:
    return XML_L("unexpected parser state - please send a bug report");
  case XML_ERROR_ENTITY_DECLARED_IN_PE:
    return XML_L("entity declared in parameter entity");
  case XML_ERROR_FEATURE_REQUIRES_XML_DTD:
    return XML_L("requested feature requires XML_DTD support in Expat");
  case XML_ERROR_CANT_CHANGE_FEATURE_ONCE_PARSING:
    return XML_L("cannot change setting once parsing has begun");
  /* Added in 1.95.7. */
  case XML_ERROR_UNBOUND_PREFIX:
    return XML_L("unbound prefix");
  /* Added in 1.95.8. */
  case XML_ERROR_UNDECLARING_PREFIX:
    return XML_L("must not undeclare prefix");
  case XML_ERROR_INCOMPLETE_PE:
    return XML_L("incomplete markup in parameter entity");
  case XML_ERROR_XML_DECL:
    return XML_L("XML declaration not well-formed");
  case XML_ERROR_TEXT_DECL:
    return XML_L("text declaration not well-formed");
  case XML_ERROR_PUBLICID:
    return XML_L("illegal character(s) in public id");
  case XML_ERROR_SUSPENDED:
    return XML_L("parser suspended");
  case XML_ERROR_NOT_SUSPENDED:
    return XML_L("parser not suspended");
  case XML_ERROR_ABORTED:
    return XML_L("parsing aborted");
  case XML_ERROR_FINISHED:
    return XML_L("parsing finished");
  case XML_ERROR_SUSPEND_PE:
    return XML_L("cannot suspend in external parameter entity");
  /* Added in 2.0.0. */
  case XML_ERROR_RESERVED_PREFIX_XML:
    return XML_L(
        "reserved prefix (xml) must not be undeclared or bound to another namespace name");
  case XML_ERROR_RESERVED_PREFIX_XMLNS:
    return XML_L("reserved prefix (xmlns) must not be declared or undeclared");
  case XML_ERROR_RESERVED_NAMESPACE_URI:
    return XML_L(
        "prefix must not be bound to one of the reserved namespace names");
  /* Added in 2.2.5. */
  case XML_ERROR_INVALID_ARGUMENT: /* Constant added in 2.2.1, already */
    return XML_L("invalid argument");
    /* Added in 2.3.0. */
  case XML_ERROR_NO_BUFFER:
    return XML_L(
        "a successful prior call to function XML_GetBuffer is required");
  /* Added in 2.4.0. */
  case XML_ERROR_AMPLIFICATION_LIMIT_BREACH:
    return XML_L(
        "limit on input amplification factor (from DTD and entities) breached");
  /* Added in 2.6.4. */
  case XML_ERROR_NOT_STARTED:
    return XML_L("parser not started");
  }
  return NULL;
}